

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::DefaultSampling<int>::genFixeds
          (DefaultSampling<int> *this,FloatFormat *param_1,vector<int,_std::allocator<int>_> *dst)

{
  int *piVar1;
  iterator iVar2;
  int local_14 [3];
  
  local_14[2] = 0;
  iVar2._M_current =
       (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  piVar1 = (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(dst,iVar2,local_14 + 2);
    iVar2._M_current =
         (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar2._M_current = 0;
    iVar2._M_current = iVar2._M_current + 1;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current;
  }
  local_14[1] = 0xffffffff;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(dst,iVar2,local_14 + 1);
    iVar2._M_current =
         (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar2._M_current = -1;
    iVar2._M_current = iVar2._M_current + 1;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current;
  }
  local_14[0] = 1;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(dst,iVar2,local_14);
  }
  else {
    *iVar2._M_current = 1;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current + 1;
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat&, vector<int>& dst) const
	{
		dst.push_back(0);
		dst.push_back(-1);
		dst.push_back(1);
	}